

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

QRectF * __thiscall QLabelPrivate::layoutRect(QLabelPrivate *this)

{
  long *plVar1;
  double *pdVar2;
  QLabelPrivate *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  qreal qVar4;
  qreal aheight;
  qreal yo;
  qreal rh;
  QRectF cr;
  QWidgetTextControl *in_stack_ffffffffffffff50;
  QLabelPrivate *in_stack_ffffffffffffff58;
  QRectF *in_stack_ffffffffffffff60;
  double local_80;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  QSizeF local_48;
  QRect local_38;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  local_28.w = -NAN;
  local_28.h = -NAN;
  local_38 = documentRect(in_RSI);
  QRectF::QRectF(in_stack_ffffffffffffff60,(QRect *)in_stack_ffffffffffffff58);
  if (in_RSI->control == (QWidgetTextControl *)0x0) {
    in_RDI->xp = local_28.xp;
    in_RDI->yp = local_28.yp;
    in_RDI->w = local_28.w;
    in_RDI->h = local_28.h;
  }
  else {
    ensureTextLayouted(in_stack_ffffffffffffff58);
    QWidgetTextControl::document(in_stack_ffffffffffffff50);
    plVar1 = (long *)QTextDocument::documentLayout();
    local_48.wd = (qreal)(**(code **)(*plVar1 + 0x78))();
    qVar3 = QSizeF::height(&local_48);
    local_80 = 0.0;
    if ((in_RSI->align & 0x80U) == 0) {
      if ((in_RSI->align & 0x40U) != 0) {
        qVar4 = QRectF::height(&local_28);
        local_60 = qVar4 - qVar3;
        local_68 = 0.0;
        pdVar2 = qMax<double>(&local_60,&local_68);
        local_80 = *pdVar2;
      }
    }
    else {
      qVar4 = QRectF::height(&local_28);
      local_50 = (qVar4 - qVar3) / 2.0;
      local_58 = 0.0;
      pdVar2 = qMax<double>(&local_50,&local_58);
      local_80 = *pdVar2;
    }
    qVar3 = QRectF::x(&local_28);
    qVar4 = QRectF::y(&local_28);
    local_80 = local_80 + qVar4;
    qVar4 = QRectF::width(&local_28);
    aheight = QRectF::height(&local_28);
    QRectF::QRectF(in_RDI,qVar3,local_80,qVar4,aheight);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QRectF QLabelPrivate::layoutRect() const
{
    QRectF cr = documentRect();
    if (!control)
        return cr;
    ensureTextLayouted();
    // Calculate y position manually
    qreal rh = control->document()->documentLayout()->documentSize().height();
    qreal yo = 0;
    if (align & Qt::AlignVCenter)
        yo = qMax((cr.height()-rh)/2, qreal(0));
    else if (align & Qt::AlignBottom)
        yo = qMax(cr.height()-rh, qreal(0));
    return QRectF(cr.x(), yo + cr.y(), cr.width(), cr.height());
}